

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_demo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  Geometry *pGVar2;
  double *pdVar3;
  MeshFactory *pMVar4;
  pointer *ppPVar5;
  pointer *ppPVar6;
  pointer pcVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  _func_int **pp_Var10;
  pointer pPVar11;
  pointer pPVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  element_type *peVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  Index IVar16;
  Index IVar17;
  char cVar18;
  uint uVar19;
  int iVar20;
  DstEvaluatorType dstEvaluator;
  options_description_easy_init *poVar21;
  typed_value<int,_char> *ptVar22;
  const_iterator cVar23;
  ostream *poVar24;
  variable_value *pvVar25;
  uint *puVar26;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar27;
  TriaO1 *pTVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  tuple<lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_> tVar30;
  double *pdVar31;
  undefined4 extraout_var;
  long *plVar32;
  long *plVar33;
  Scalar *pSVar34;
  undefined8 *puVar35;
  ulong uVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  long lVar39;
  long lVar40;
  Index index;
  long extraout_RDX;
  ulong uVar41;
  pointer pbVar42;
  ActualDstType actualDst;
  long lVar43;
  pointer ppVar44;
  Index index_4;
  pointer pbVar45;
  pointer ppVar46;
  pointer ppVar47;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar48;
  Index index_5;
  long lVar49;
  PointerType ptr;
  uint uVar50;
  Index col;
  ulong uVar51;
  ulong uVar52;
  double cst_min_norm_pos [2];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  pointer ppVar59;
  uint uVar60;
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  int iVar68;
  double dVar66;
  double dVar67;
  double dVar69;
  double dVar70;
  double dVar71;
  ulong uVar72;
  pointer ppVar74;
  undefined1 auVar73 [16];
  ulong uVar75;
  double dVar76;
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  MatrixXd A;
  MatrixXd mapped_points;
  MatrixXd points;
  VectorXd b;
  VectorXd x;
  VectorXd errors;
  VectorXd integration_elements;
  shared_ptr<lf::mesh::Mesh> base_mesh;
  MeshHierarchy mh;
  MeshFactory mesh_factory;
  VtkWriter vtk_writer;
  options_description desc;
  variables_map vm;
  DenseStorage<double,__1,__1,__1,_0> local_728;
  assign_op<double,_double> local_709;
  Matrix<double,__1,__1,_0,__1,__1> local_708;
  undefined1 local_6e8 [16];
  scalar_constant_op<double> local_6d8;
  XprTypeNested local_6d0;
  bool local_6c8;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_6a8;
  uint local_6a0;
  uint local_69c;
  undefined1 local_698 [32];
  Matrix<double,__1,_1,_0,__1,_1> MStack_678;
  pointer pvStack_668;
  pointer local_660;
  pointer local_648;
  pointer ppStack_640;
  shared_ptr<lf::mesh::Mesh> local_638;
  undefined1 local_628 [8];
  Matrix<double,__1,__1,_0,__1,__1> MStack_620;
  Matrix<double,__1,_1,_0,__1,_1> local_608;
  pointer local_5f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_5e8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_5d8;
  string local_5b8;
  undefined1 *local_598 [2];
  coord_t local_588;
  coord_t local_578;
  coord_t local_568;
  coord_t local_558;
  coord_t local_548;
  coord_t local_538;
  shared_ptr<const_lf::mesh::Mesh> local_520;
  undefined1 local_510 [16];
  undefined1 local_500 [24];
  pointer ppStack_4e8;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_4e0;
  pointer ppStack_4d8;
  pointer local_4d0;
  pointer ppStack_4c8;
  pointer local_4c0;
  variable_if_dynamic<long,__1> local_4b0;
  scalar_constant_op<double> local_4a0;
  pointer local_448;
  undefined8 uStack_440;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_438;
  ulong local_428;
  long local_420;
  ulong local_418;
  undefined **local_410;
  ulong local_408;
  undefined8 *local_400;
  double local_3f8;
  double local_3f0;
  MeshFactory local_3e8;
  undefined1 local_388 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  pointer local_358;
  pointer ppStack_350;
  pointer local_348;
  variable_if_dynamic<long,__1> local_338;
  scalar_constant_op<double> local_328;
  options_description local_1a8;
  function1<std::pair<std::string,_std::string>,_const_std::string_&> local_128;
  variables_map local_100;
  
  pcVar7 = local_388 + 0x10;
  local_388._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Allowed options","");
  boost::program_options::options_description::options_description
            (&local_1a8,(string *)local_388,0x50,0x28);
  if ((pointer)local_388._0_8_ != pcVar7) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  local_388._0_8_ = boost::program_options::options_description::add_options(&local_1a8);
  poVar21 = boost::program_options::options_description_easy_init::operator()
                      ((options_description_easy_init *)local_388,"help","produce this help message"
                      );
  ptVar22 = boost::program_options::value<int>((int *)0x0);
  local_500._0_4_ = 3;
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value(ptVar22,(int *)local_500);
  poVar21 = boost::program_options::options_description_easy_init::operator()
                      (poVar21,"quad_degree",(value_semantic *)ptVar22,
                       "The degree of the local quadrature rule.");
  ptVar22 = boost::program_options::value<int>((int *)0x0);
  local_100.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)
       CONCAT44(local_100.super_abstract_variables_map._vptr_abstract_variables_map._4_4_,5);
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value(ptVar22,(int *)&local_100)
  ;
  boost::program_options::options_description_easy_init::operator()
            (poVar21,"max_level",(value_semantic *)ptVar22,"The number of refinement levels");
  boost::program_options::variables_map::variables_map(&local_100);
  local_128.super_function_base.vtable = (vtable_base *)0x0;
  local_128.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_128.super_function_base.functor._8_8_ = 0;
  local_128.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_388,argc,argv,&local_1a8,0,&local_128);
  boost::program_options::store((parsed_options *)local_388,&local_100,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_388);
  boost::
  function_n<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function_n(&local_128);
  boost::program_options::notify(&local_100);
  local_388._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"help","");
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(&local_100.
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   ._M_t,(key_type *)local_388);
  if ((pointer)local_388._0_8_ != pcVar7) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar23._M_node ==
      &local_100.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    local_388._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"max_level","");
    pvVar25 = boost::program_options::abstract_variables_map::operator[]
                        (&local_100.super_abstract_variables_map,(string *)local_388);
    puVar26 = (uint *)boost::any_cast<int_const&>(&pvVar25->v);
    uVar50 = *puVar26;
    if ((pointer)local_388._0_8_ != pcVar7) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    local_388._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"quad_degree","");
    pvVar25 = boost::program_options::abstract_variables_map::operator[]
                        (&local_100.super_abstract_variables_map,(string *)local_388);
    puVar26 = (uint *)boost::any_cast<int_const&>(&pvVar25->v);
    local_69c = *puVar26;
    if ((pointer)local_388._0_8_ != pcVar7) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    local_410 = &PTR_DimWorld_0045b4a0;
    local_3e8.super_MeshFactory._vptr_MeshFactory = (_func_int **)&PTR_DimWorld_0045b4a0;
    local_3e8.dim_world_ = 2;
    local_3e8.nodes_.
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.nodes_.
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.nodes_.
    super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.edges_.
    super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.edges_.
    super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.edges_.
    super__Vector_base<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_2UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.elements_.
    super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.elements_.
    super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.elements_.
    super__Vector_base<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>,_std::allocator<std::pair<std::array<unsigned_int,_4UL>,_std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.check_completeness_ = true;
    local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0
    ;
    local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         0.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_538);
    free(local_538.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.5
    ;
    local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         0.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_548);
    free(local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0
    ;
    local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         0.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_558);
    free(local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0
    ;
    local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         1.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_568);
    free(local_568.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.5
    ;
    local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         1.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_578);
    free(local_578.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)Eigen::internal::aligned_malloc(0x10);
    local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
    *local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0
    ;
    local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         1.0;
    lf::mesh::hybrid2d::MeshFactory::AddPoint(&local_3e8,&local_588);
    free(local_588.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_5d8.m_storage.m_data = (double *)0x0;
    local_5d8.m_storage.m_rows = 0;
    local_5d8.m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_5d8,2,3);
    local_500._0_8_ = (non_const_type)0x0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_5d8,(Scalar *)local_500);
    local_698._0_8_ = &DAT_3fe0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
                         (Scalar *)local_698);
    local_628 = (undefined1  [8])0x3fe0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_628);
    local_6e8._0_8_ =
         (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_6e8);
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)&local_708);
    local_728.m_data = (double *)&DAT_3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar27,(Scalar *)&local_728);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388);
    local_628 = (undefined1  [8])0x100000000;
    MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)
         CONCAT44(MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data._4_4_,4);
    __l._M_len = 3;
    __l._M_array = (iterator)local_628;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388,__l,
               (allocator_type *)&local_708);
    local_698._8_8_ = (long)(local_388._8_8_ - local_388._0_8_) >> 2;
    local_698._0_8_ = local_388._0_8_;
    pTVar28 = (TriaO1 *)operator_new(0x40);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_500,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5d8);
    lf::geometry::TriaO1::TriaO1(pTVar28,(Matrix<double,__1,_3,_0,__1,_3> *)local_500);
    free((void *)local_500._0_8_);
    local_6e8._0_8_ = pTVar28;
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              (&local_3e8,(RefEl)0x3,(span<const_unsigned_int,_18446744073709551615UL> *)local_698,
               (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
               local_6e8);
    if ((TriaO1 *)local_6e8._0_8_ != (TriaO1 *)0x0) {
      (*((Geometry *)local_6e8._0_8_)->_vptr_Geometry[0xb])();
    }
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
    }
    local_500._0_8_ = (non_const_type)0x0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_5d8,(Scalar *)local_500);
    local_698._0_8_ = &DAT_3fe0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
                         (Scalar *)local_698);
    local_628 = (undefined1  [8])0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_628);
    local_6e8._0_8_ =
         (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_6e8);
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&DAT_3ff0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)&local_708);
    local_728.m_data = (double *)&DAT_3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar27,(Scalar *)&local_728);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388);
    local_628 = (undefined1  [8])0x400000000;
    MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)
         CONCAT44(MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data._4_4_,5);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_628;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388,__l_00,
               (allocator_type *)&local_708);
    local_698._8_8_ = (long)(local_388._8_8_ - local_388._0_8_) >> 2;
    local_698._0_8_ = local_388._0_8_;
    pTVar28 = (TriaO1 *)operator_new(0x40);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_500,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5d8);
    lf::geometry::TriaO1::TriaO1(pTVar28,(Matrix<double,__1,_3,_0,__1,_3> *)local_500);
    free((void *)local_500._0_8_);
    local_6e8._0_8_ = pTVar28;
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              (&local_3e8,(RefEl)0x3,(span<const_unsigned_int,_18446744073709551615UL> *)local_698,
               (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
               local_6e8);
    if ((TriaO1 *)local_6e8._0_8_ != (TriaO1 *)0x0) {
      (*((Geometry *)local_6e8._0_8_)->_vptr_Geometry[0xb])();
    }
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
    }
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (pointer)0x0;
    local_388._16_8_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,2,4);
    IVar17 = local_5d8.m_storage.m_cols;
    IVar16 = local_5d8.m_storage.m_rows;
    pdVar31 = local_5d8.m_storage.m_data;
    local_5d8.m_storage.m_data = (double *)local_388._0_8_;
    local_388._0_8_ = pdVar31;
    local_5d8.m_storage.m_rows = local_388._8_8_;
    local_5d8.m_storage.m_cols = local_388._16_8_;
    local_388._8_8_ = IVar16;
    local_388._16_8_ = IVar17;
    free(pdVar31);
    local_500._0_8_ = &DAT_3fe0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_5d8,(Scalar *)local_500);
    local_698._0_8_ = &DAT_3ff0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
                         (Scalar *)local_698);
    local_628 = (undefined1  [8])0x3ff0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_628);
    local_6e8._0_8_ =
         (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
         0x3fe0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_6e8);
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)&local_708);
    local_728.m_data = (double *)0x0;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)&local_728);
    local_598[0] = &DAT_3ff0000000000000;
    pCVar27 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar27,(Scalar *)local_598);
    local_438.m_storage.m_data.array[0] = (double)&DAT_3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
              (pCVar27,(Scalar *)&local_438);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388);
    local_698._0_8_ = (pointer)0x200000001;
    local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000003;
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)local_698;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_388,__l_01,
               (allocator_type *)&local_708);
    local_500._8_8_ = (long)(local_388._8_8_ - local_388._0_8_) >> 2;
    local_500._0_8_ = local_388._0_8_;
    std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_6e8);
    local_628 = (undefined1  [8])local_6e8._0_8_;
    local_6e8._0_8_ = (Geometry *)0x0;
    lf::mesh::hybrid2d::MeshFactory::AddEntity
              (&local_3e8,(RefEl)0x4,(span<const_unsigned_int,_18446744073709551615UL> *)local_500,
               (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
               local_628);
    if (local_628 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_628)[0xb])();
    }
    local_628 = (undefined1  [8])0x0;
    if ((_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>)
        local_6e8._0_8_ != (Geometry *)0x0) {
      (**(code **)(*(long *)local_6e8._0_8_ + 0x58))();
    }
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
    }
    lf::mesh::hybrid2d::MeshFactory::Build((MeshFactory *)local_510);
    local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_510._0_8_;
    local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_510._8_8_ + 8) = *(_Atomic_word *)(local_510._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_510._8_8_ + 8) = *(_Atomic_word *)(local_510._8_8_ + 8) + 1;
      }
    }
    local_6a0 = uVar50 + 1;
    local_5e8.m_storage.m_data = (double *)0x0;
    local_5e8.m_storage.m_rows = 0;
    local_420 = (long)(int)local_6a0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_5e8,local_420);
    local_428 = (ulong)uVar50;
    if (-1 < (int)uVar50) {
      local_418 = (ulong)local_6a0;
      uVar41 = 0;
      do {
        local_520.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_520.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
        if (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        uVar50 = 1;
        if (9 < uVar41) {
          uVar60 = 4;
          uVar36 = uVar41;
          do {
            uVar50 = uVar60;
            uVar19 = (uint)uVar36;
            if (uVar19 < 100) {
              uVar50 = uVar50 - 2;
              goto LAB_0011a099;
            }
            if (uVar19 < 1000) {
              uVar50 = uVar50 - 1;
              goto LAB_0011a099;
            }
            if (uVar19 < 10000) goto LAB_0011a099;
            uVar36 = (uVar36 & 0xffffffff) / 10000;
            uVar60 = uVar50 + 4;
          } while (99999 < uVar19);
          uVar50 = uVar50 + 1;
        }
LAB_0011a099:
        local_698._0_8_ = local_698 + 0x10;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698,
                     (ulong)uVar50,'-');
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_698._0_8_,uVar50,(uint)uVar41)
        ;
        pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_698,0,0,"level",5);
        local_500._0_8_ = (pbVar29->_M_dataplus)._M_p;
        paVar37 = &pbVar29->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._0_8_ == paVar37) {
          local_500._16_8_ = paVar37->_M_allocated_capacity;
          ppStack_4e8 = *(pointer *)((long)&pbVar29->field_2 + 8);
          local_500._0_8_ = (non_const_type)(local_500 + 0x10);
        }
        else {
          local_500._16_8_ = paVar37->_M_allocated_capacity;
        }
        local_500._8_8_ = pbVar29->_M_string_length;
        (pbVar29->_M_dataplus)._M_p = (pointer)paVar37;
        pbVar29->_M_string_length = 0;
        (pbVar29->field_2)._M_local_buf[0] = '\0';
        pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_500,".vtk");
        local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
        paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar29->_M_dataplus)._M_p;
        paVar38 = &pbVar29->field_2;
        if (paVar37 == paVar38) {
          local_5b8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
          local_5b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar29->field_2 + 8);
        }
        else {
          local_5b8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
          local_5b8._M_dataplus._M_p = (pointer)paVar37;
        }
        local_5b8._M_string_length = pbVar29->_M_string_length;
        (pbVar29->_M_dataplus)._M_p = (pointer)paVar38;
        pbVar29->_M_string_length = 0;
        (pbVar29->field_2)._M_local_buf[0] = '\0';
        lf::io::VtkWriter::VtkWriter((VtkWriter *)local_388,&local_520,&local_5b8,0,'\x01');
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if ((non_const_type)local_500._0_8_ != (non_const_type)(local_500 + 0x10)) {
          operator_delete((void *)local_500._0_8_,(ulong)(local_500._16_8_ + 1));
        }
        if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
          operator_delete((void *)local_698._0_8_,local_698._16_8_ + 1);
        }
        if (local_520.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_520.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        peVar15 = local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lf::quad::make_QuadRule((QuadRule *)local_698,(RefEl)0x3,local_69c);
        lf::quad::make_QuadRule((QuadRule *)local_628,(RefEl)0x4,local_69c);
        local_6e8._0_8_ =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             0x0;
        local_6e8._8_8_ = 0.0;
        local_6d8.m_other = 0.0;
        tVar30.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
              )malloc(8);
        if (tVar30.
            super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
            .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl ==
            (_Head_base<0UL,_lf::geometry::Geometry_*,_false>)0x0) {
          puVar35 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar35 = &std::out_of_range::vtable;
          __cxa_throw(puVar35,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_6e8._8_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x1;
        local_6d8.m_other = 4.94065645841247e-324;
        local_728.m_data = (double *)0x0;
        local_728.m_rows = 0;
        local_6e8._0_8_ =
             tVar30.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        pdVar31 = (double *)malloc(8);
        if (pdVar31 == (double *)0x0) {
          puVar35 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar35 = &std::out_of_range::vtable;
          __cxa_throw(puVar35,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_728.m_rows = 1;
        local_728.m_data = pdVar31;
        iVar20 = (*(code *)(((((_Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                *)&peVar15->_vptr_Mesh)->_M_impl).super__Vector_impl_data._M_start)
                           ->child_cell_idx).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)(peVar15,0);
        puVar35 = (undefined8 *)CONCAT44(extraout_var,iVar20);
        local_648 = (pointer)0xbfd45f306dc9c883;
        ppStack_640 = (pointer)0x0;
        if (extraout_RDX != 0) {
          local_400 = puVar35 + extraout_RDX;
          local_648 = (pointer)0x0;
          ppStack_640 = (pointer)0x0;
          local_408 = uVar41;
          do {
            plVar33 = (long *)*puVar35;
            cVar18 = (**(code **)(*plVar33 + 0x20))(plVar33);
            pdVar31 = MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data;
            uVar14 = local_698._8_8_;
            if (cVar18 == '\x03') {
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_6e8,
                         (Matrix<double,__1,__1,_0,__1,__1> *)(local_698 + 8),
                         (assign_op<double,_double> *)local_500);
              pdVar31 = MStack_678.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              lVar39 = (long)local_6d8.m_other * local_6e8._8_8_;
              uVar41 = lVar39 - (lVar39 >> 0x3f) & 0xfffffffffffffffe;
              if (1 < lVar39) {
                lVar43 = 0;
                do {
                  plVar32 = (long *)(uVar14 + lVar43 * 8);
                  pp_Var10 = (_func_int **)plVar32[1];
                  pGVar2 = (Geometry *)(local_6e8._0_8_ + lVar43 * 8);
                  pGVar2->_vptr_Geometry = (_func_int **)*plVar32;
                  pGVar2[1]._vptr_Geometry = pp_Var10;
                  lVar43 = lVar43 + 2;
                } while (lVar43 < (long)uVar41);
              }
              if ((long)uVar41 < lVar39) {
                do {
                  ((Geometry *)(local_6e8._0_8_ + uVar41 * 8))->_vptr_Geometry =
                       *(_func_int ***)(uVar14 + uVar41 * 8);
                  uVar41 = uVar41 + 1;
                } while (lVar39 - uVar41 != 0);
              }
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                        ((Matrix<double,__1,_1,_0,__1,_1> *)&local_728,&MStack_678,
                         (assign_op<double,_double> *)local_500);
              uVar41 = local_728.m_rows - (local_728.m_rows >> 0x3f) & 0xfffffffffffffffe;
              if (1 < local_728.m_rows) {
                lVar39 = 0;
                do {
                  pMVar4 = (MeshFactory *)((long)pdVar31 + lVar39 * 8);
                  pp_Var10 = pMVar4[1]._vptr_MeshFactory;
                  local_728.m_data[lVar39] = (double)pMVar4->_vptr_MeshFactory;
                  (local_728.m_data + lVar39)[1] = (double)pp_Var10;
                  lVar39 = lVar39 + 2;
                } while (lVar39 < (long)uVar41);
              }
              if ((long)uVar41 < local_728.m_rows) {
                do {
                  local_728.m_data[uVar41] =
                       (double)((MeshFactory *)((long)pdVar31 + uVar41 * 8))->_vptr_MeshFactory;
                  uVar41 = uVar41 + 1;
                } while (local_728.m_rows != uVar41);
              }
            }
            else {
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_6e8,&MStack_620,
                         (assign_op<double,_double> *)local_500);
              pdVar3 = local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              lVar39 = (long)local_6d8.m_other * local_6e8._8_8_;
              uVar41 = lVar39 - (lVar39 >> 0x3f) & 0xfffffffffffffffe;
              if (1 < lVar39) {
                lVar43 = 0;
                do {
                  ppPVar5 = &(((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                                *)pdVar31)->
                             super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar43;
                  pPVar11 = ppPVar5[1];
                  pGVar2 = (Geometry *)(local_6e8._0_8_ + lVar43 * 8);
                  pGVar2->_vptr_Geometry = (_func_int **)*ppPVar5;
                  pGVar2[1]._vptr_Geometry = (_func_int **)pPVar11;
                  lVar43 = lVar43 + 2;
                } while (lVar43 < (long)uVar41);
              }
              if ((long)uVar41 < lVar39) {
                do {
                  ((Geometry *)(local_6e8._0_8_ + uVar41 * 8))->_vptr_Geometry =
                       (_func_int **)
                       (&(((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                            *)pdVar31)->
                         super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start)[uVar41];
                  uVar41 = uVar41 + 1;
                } while (lVar39 - uVar41 != 0);
              }
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                        ((Matrix<double,__1,_1,_0,__1,_1> *)&local_728,&local_608,
                         (assign_op<double,_double> *)local_500);
              uVar41 = local_728.m_rows - (local_728.m_rows >> 0x3f) & 0xfffffffffffffffe;
              if (1 < local_728.m_rows) {
                lVar39 = 0;
                do {
                  ppPVar6 = (pointer *)
                            (&(((_Bvector_base<std::allocator<bool>_> *)pdVar3)->_M_impl).
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            lVar39);
                  pPVar12 = ppPVar6[1];
                  local_728.m_data[lVar39] = (double)*ppPVar6;
                  (local_728.m_data + lVar39)[1] = (double)pPVar12;
                  lVar39 = lVar39 + 2;
                } while (lVar39 < (long)uVar41);
              }
              if ((long)uVar41 < local_728.m_rows) {
                do {
                  local_728.m_data[uVar41] =
                       (double)(&(((_Bvector_base<std::allocator<bool>_> *)pdVar3)->_M_impl).
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                               [uVar41];
                  uVar41 = uVar41 + 1;
                } while (local_728.m_rows != uVar41);
              }
            }
            plVar32 = (long *)(**(code **)(*plVar33 + 0x18))(plVar33);
            (**(code **)(*plVar32 + 0x18))(&local_708,plVar32,local_6e8);
            plVar33 = (long *)(**(code **)(*plVar33 + 0x18))(plVar33);
            (**(code **)(*plVar33 + 0x30))
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_598,
                       plVar33,local_6e8);
            if (0 < (long)local_6d8.m_other) {
              lVar39 = 0;
              do {
                Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_500
                           ,&local_708,lVar39);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                          (&local_438,local_500._8_8_,1);
                uVar14 = local_500._0_8_;
                Eigen::internal::
                resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                          ((Matrix<double,_2,_1,_0,_2,_1> *)&local_438,
                           (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_500
                           ,&local_709);
                local_438.m_storage.m_data.array[0] =
                     (double)(((tuple<lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                                *)&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    uVar14)->m_storage).m_data)->
                             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                             ).super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
                local_438.m_storage.m_data.array[1] =
                     (double)(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar14)->
                             m_storage).m_rows;
                local_448 = (pointer)sin(local_438.m_storage.m_data.array[0] * 3.141592653589793);
                local_3f0 = cos(local_438.m_storage.m_data.array[1] * 3.141592653589793);
                pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                     &local_728,lVar39);
                local_3f8 = *pSVar34;
                pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                     local_598,lVar39);
                local_648 = (pointer)((double)local_648 +
                                     (double)local_448 * local_3f0 * local_3f0 * local_3f8 *
                                     *pSVar34);
                lVar39 = lVar39 + 1;
              } while (lVar39 < (long)local_6d8.m_other);
            }
            free(local_598[0]);
            free(local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            puVar35 = puVar35 + 1;
          } while (puVar35 != local_400);
          local_648 = (pointer)((double)local_648 + -0.3183098861837907);
          uVar41 = local_408;
        }
        free(local_728.m_data);
        free((void *)local_6e8._0_8_);
        free(local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free(MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(MStack_678.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        free((void *)local_698._8_8_);
        pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &local_5e8,uVar41);
        *pSVar34 = ABS((double)local_648);
        local_6a8._M_t.
        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
             (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
             operator_new(0x60);
        *(undefined ***)
         local_6a8._M_t.
         super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
         .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = local_410;
        *(undefined4 *)
         ((long)local_6a8._M_t.
                super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 8) = 2;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x10)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x18)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x20)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x28)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x30)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x38)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x40)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x48)
             = 0;
        *(long *)((long)local_6a8._M_t.
                        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x50)
             = 0;
        *(undefined1 *)
         ((long)local_6a8._M_t.
                super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl + 0x58) = 1;
        lf::refinement::MeshHierarchy::MeshHierarchy
                  ((MeshHierarchy *)local_500,&local_638,
                   (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *
                   )&local_6a8);
        if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
            local_6a8._M_t.
            super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
            .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl !=
            (MeshFactory *)0x0) {
          (**(code **)(*(long *)local_6a8._M_t.
                                super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                                .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl
                      + 0x38))();
        }
        local_6a8._M_t.
        super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
        .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
             (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
             (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
             )0x0;
        lf::refinement::MeshHierarchy::RefineRegular((MeshHierarchy *)local_500,rp_regular);
        lf::refinement::MeshHierarchy::getMesh
                  ((MeshHierarchy *)local_698,(size_type)(MeshHierarchy *)local_500);
        this._M_pi = local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
        local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_698._0_8_;
        local_698._0_8_ = (pointer)0x0;
        local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_);
        }
        lf::refinement::MeshHierarchy::~MeshHierarchy((MeshHierarchy *)local_500);
        lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_388);
        uVar41 = uVar41 + 1;
      } while (uVar41 != local_418);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"measured errors for each level: ",0x20);
    local_388[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_388,1);
    poVar24 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_5e8);
    local_388[0] = (string)0xa;
    poVar24 = std::__ostream_insert<char,std::char_traits<char>>(poVar24,local_388,1);
    local_388[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,local_388,1);
    lVar39 = local_420;
    local_728.m_data = (double *)0x0;
    local_728.m_rows = 0;
    local_728.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_728,local_420,2)
    ;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_388,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_728,0);
    local_698._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_500,local_388._8_8_,1,(scalar_constant_op<double> *)local_698);
    local_648 = (pointer)local_500._16_8_;
    ppStack_640 = (pointer)0x0;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_388,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)local_500,(assign_op<double,_double> *)local_698);
    auVar58 = _DAT_0039e110;
    auVar8 = _DAT_0039e100;
    pbVar42 = (pointer)local_388._8_8_;
    if (((local_388._0_8_ & 7) == 0) &&
       (pbVar42 = (pointer)(ulong)((uint)((ulong)local_388._0_8_ >> 3) & 1),
       (long)local_388._8_8_ <= (long)pbVar42)) {
      pbVar42 = (pointer)local_388._8_8_;
    }
    lVar43 = local_388._8_8_ - (long)pbVar42;
    if (0 < (long)pbVar42) {
      puVar1 = &pbVar42[-1].field_0x5f;
      auVar53._8_4_ = (int)puVar1;
      auVar53._0_8_ = puVar1;
      auVar53._12_4_ = (int)((ulong)puVar1 >> 0x20);
      uVar41 = 0;
      auVar53 = auVar53 ^ _DAT_0039e100;
      auVar63 = _DAT_0039e0f0;
      do {
        bVar9 = auVar53._0_4_ < SUB164(auVar63 ^ auVar8,0);
        iVar20 = auVar53._4_4_;
        iVar68 = SUB164(auVar63 ^ auVar8,4);
        if ((bool)(~(iVar20 < iVar68 || iVar68 == iVar20 && bVar9) & 1)) {
          *(pointer *)(local_388._0_8_ + uVar41 * 8) = local_648;
        }
        if (iVar20 >= iVar68 && (iVar68 != iVar20 || !bVar9)) {
          *(pointer *)(local_388._0_8_ + uVar41 * 8 + 8) = local_648;
        }
        uVar41 = uVar41 + 2;
        lVar49 = auVar63._8_8_;
        auVar63._0_8_ = auVar63._0_8_ + auVar58._0_8_;
        auVar63._8_8_ = lVar49 + auVar58._8_8_;
      } while (((ulong)((long)&(pbVar42->string_key)._M_dataplus._M_p + 1U) & 0xfffffffffffffffe) !=
               uVar41);
    }
    lVar49 = (long)&(pbVar42->string_key)._M_dataplus._M_p +
             (lVar43 - (lVar43 >> 0x3f) & 0xfffffffffffffffeU);
    pbVar45 = pbVar42;
    if (1 < lVar43) {
      do {
        *(size_type *)(local_388._0_8_ + (long)pbVar45 * 8) = (size_type)local_648;
        ((size_type *)(local_388._0_8_ + (long)pbVar45 * 8))[1] = (size_type)local_648;
        pbVar45 = (pointer)((long)&(pbVar45->string_key)._M_dataplus._M_p + 2);
      } while ((long)pbVar45 < lVar49);
    }
    auVar58 = _DAT_0039e100;
    auVar8 = _DAT_0039e0f0;
    if (lVar49 < (long)local_388._8_8_) {
      lVar40 = local_388._8_8_ + (-1 - lVar49);
      auVar54._8_4_ = (int)lVar40;
      auVar54._0_8_ = lVar40;
      auVar54._12_4_ = (int)((ulong)lVar40 >> 0x20);
      lVar43 = (lVar43 / 2) * 0x10 + (long)pbVar42 * 8;
      uVar41 = 0;
      auVar54 = auVar54 ^ _DAT_0039e100;
      do {
        auVar62._8_4_ = (int)uVar41;
        auVar62._0_8_ = uVar41;
        auVar62._12_4_ = (int)(uVar41 >> 0x20);
        auVar63 = (auVar62 | auVar8) ^ auVar58;
        bVar9 = auVar54._0_4_ < auVar63._0_4_;
        iVar20 = auVar54._4_4_;
        iVar68 = auVar63._4_4_;
        if ((bool)(~(iVar20 < iVar68 || iVar68 == iVar20 && bVar9) & 1)) {
          *(pointer *)(local_388._0_8_ + uVar41 * 8 + lVar43) = local_648;
        }
        if (iVar20 >= iVar68 && (iVar68 != iVar20 || !bVar9)) {
          *(pointer *)(local_388._0_8_ + uVar41 * 8 + lVar43 + 8) = local_648;
        }
        uVar41 = uVar41 + 2;
      } while ((local_388._8_8_ + (1 - lVar49) & 0xfffffffffffffffeU) != uVar41);
    }
    local_6e8._8_8_ = (undefined8)(int)local_6a0;
    local_6d8.m_other = (double)(lVar39 + -1);
    local_6e8._0_8_ =
         (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
         0x3ff0000000000000;
    local_6d0 = (XprTypeNested)0x0;
    if ((int)local_428 == 0) {
      local_6d8.m_other = 4.94065645841247e-324;
    }
    else {
      local_6d0 = (XprTypeNested)((double)(int)local_428 / (double)(long)local_6d8.m_other);
    }
    local_6c8 = ABS((double)local_6e8._8_8_) < 1.0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::
    CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>
                    *)local_628,lVar39,1,(linspaced_op<double> *)local_6e8);
    local_698._8_8_ = local_628;
    local_698._16_8_ =
         MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data;
    local_698._24_8_ =
         MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
    MStack_678.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols;
    MStack_678.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
    pvStack_668 = (pointer)local_608.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows;
    local_660 = local_5f8;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x3fe62e42fefa39ef;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>
                      *)local_6e8,(Index)local_628,1,(scalar_constant_op<double> *)&local_708);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                     *)local_500,(Lhs *)local_698,(Rhs *)local_6e8,
                    (scalar_product_op<double,_double> *)local_598);
    local_388._16_8_ = local_500._16_8_;
    local_388._24_8_ = ppStack_4e8;
    local_368._M_allocated_capacity =
         (size_type)
         local_4e0._M_t.
         super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
         _M_t.
         super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
         .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
    local_368._8_8_ = ppStack_4d8;
    local_358 = local_4d0;
    ppStack_350 = ppStack_4c8;
    local_348 = local_4c0;
    local_338.m_value = local_4b0.m_value;
    local_328.m_other = local_4a0.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_6e8,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_728,1);
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)local_358;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)local_368._M_allocated_capacity;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_368._8_8_;
    local_648 = ppStack_350;
    ppStack_640 = local_348;
    local_448 = (pointer)local_328.m_other;
    uStack_440 = 0;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Array<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_6e8,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_388,(assign_op<double,_double> *)local_598);
    ppVar44 = (pointer)local_6e8._8_8_;
    if (((local_6e8._0_8_ & 7) == 0) &&
       (ppVar44 = (pointer)(ulong)((uint)((ulong)local_6e8._0_8_ >> 3) & 1),
       (long)local_6e8._8_8_ <= (long)ppVar44)) {
      ppVar44 = (pointer)local_6e8._8_8_;
    }
    lVar39 = local_6e8._8_8_ - (long)ppVar44;
    uVar41 = lVar39 - (lVar39 >> 0x3f) & 0xfffffffffffffffe;
    auVar8._8_8_ = ppStack_640;
    auVar8._0_8_ = local_648;
    if (0 < (long)ppVar44) {
      ppVar47 = (pointer)0x0;
      ppVar46 = (pointer)local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols;
      do {
        if ((auVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          ppVar59 = (pointer)local_708.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
          if (ppVar46 != (pointer)0x0) {
            ppVar59 = (pointer)((double)(long)ppVar47 * (double)local_648 +
                               (double)local_708.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_data);
          }
        }
        else {
          ppVar59 = (pointer)local_708.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data;
          if (ppVar47 != (pointer)0x0) {
            ppVar59 = (pointer)((double)local_708.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_rows -
                               (double)(long)ppVar46 * (double)local_648);
          }
        }
        ((Geometry *)(local_6e8._0_8_ + ppVar47 * 8))->_vptr_Geometry =
             (_func_int **)(-(double)ppVar59 * (double)local_448);
        ppVar47 = (pointer)((long)(ppVar47->first)._M_elems + 1);
        ppVar46 = (pointer)((long)&ppVar46[-1].second._M_t.
                                   super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                                   .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>.
                                   _M_head_impl + 7);
      } while (ppVar44 != ppVar47);
    }
    ppVar46 = (pointer)((long)(ppVar44->first)._M_elems + uVar41);
    if (1 < lVar39) {
      auVar58._8_4_ = (int)local_648;
      auVar58._0_8_ = local_648;
      auVar58._12_4_ = (int)((ulong)local_648 >> 0x20);
      ppVar47 = ppVar44;
      do {
        if (((ulong)ppStack_640 & 1) == 0) {
          ppVar59 = (pointer)(((double)(long)ppVar47 + 0.0) * (double)local_648 +
                             (double)local_708.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data);
          ppVar74 = (pointer)(((double)(long)ppVar47 + 1.0) * auVar58._8_8_ +
                             (double)local_708.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data);
          if (-local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols + (long)ppVar47 == -1) {
            ppVar74 = (pointer)local_708.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows;
          }
        }
        else {
          dVar71 = (double)(-local_708.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + (long)ppVar47);
          ppVar74 = (pointer)((dVar71 + 1.0) * auVar58._8_8_ +
                             (double)local_708.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows);
          ppVar59 = (pointer)((dVar71 + 0.0) * (double)local_648 +
                             (double)local_708.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows);
          if (ppVar47 == (pointer)0x0) {
            ppVar59 = (pointer)local_708.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data;
          }
        }
        ((Geometry *)(local_6e8._0_8_ + ppVar47 * 8))->_vptr_Geometry =
             (_func_int **)(-(double)ppVar59 * (double)local_448);
        ((Geometry *)(local_6e8._0_8_ + ppVar47 * 8))[1]._vptr_Geometry =
             (_func_int **)(-(double)ppVar74 * (double)local_448);
        ppVar47 = (pointer)((long)(ppVar47->first)._M_elems + 2);
      } while ((long)ppVar47 < (long)ppVar46);
    }
    if ((long)ppVar46 < (long)local_6e8._8_8_) {
      lVar39 = local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols + (-uVar41 - (long)ppVar44);
      do {
        if ((auVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          ppVar59 = (pointer)local_708.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
          if ((pointer)local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols != ppVar46) {
            ppVar59 = (pointer)((double)(long)ppVar46 * (double)local_648 +
                               (double)local_708.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_data);
          }
        }
        else {
          ppVar59 = (pointer)local_708.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data;
          if (ppVar46 != (pointer)0x0) {
            ppVar59 = (pointer)((double)local_708.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        .m_storage.m_rows - (double)lVar39 * (double)local_648);
          }
        }
        ((Geometry *)(local_6e8._0_8_ + ppVar46 * 8))->_vptr_Geometry =
             (_func_int **)(-(double)ppVar59 * (double)local_448);
        ppVar46 = (pointer)((long)(ppVar46->first)._M_elems + 1);
        lVar39 = lVar39 + -1;
      } while ((pointer)local_6e8._8_8_ != ppVar46);
    }
    local_698._0_8_ = (pointer)0x0;
    local_698._8_8_ = 0;
    local_388._0_8_ = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_5e8;
    if ((local_5e8.m_storage.m_rows != 0) &&
       (auVar8 = ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar8 / SEXT816(local_5e8.m_storage.m_rows),0) < 1)) {
      puVar35 = (undefined8 *)
                __cxa_allocate_exception
                          (8,local_5e8.m_storage.m_rows,
                           SUB168(auVar8 % SEXT816(local_5e8.m_storage.m_rows),0));
      *puVar35 = &std::out_of_range::vtable;
      __cxa_throw(puVar35,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_698,
               local_5e8.m_storage.m_rows,1);
    lVar39 = *(long *)local_388._0_8_;
    local_500._0_8_ = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_698;
    Eigen::internal::
    resize_if_allowed<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>const>const>,double,double>
              ((Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_500,
               (MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                *)local_388,(assign_op<double,_double> *)local_628);
    auVar8 = _DAT_0039e130;
    pdVar31 = ((DenseStorage<double,__1,__1,_1,_0> *)local_500._0_8_)->m_data;
    uVar41 = ((DenseStorage<double,__1,__1,_1,_0> *)local_500._0_8_)->m_rows;
    uVar36 = uVar41 - ((long)uVar41 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar41) {
      lVar43 = 0;
      dVar71 = (double)DAT_0039e130;
      dVar55 = DAT_0039e130._8_8_;
      do {
        auVar58 = *(undefined1 (*) [16])(lVar39 + lVar43 * 8);
        dVar76 = auVar58._0_8_;
        dVar77 = auVar58._8_8_;
        auVar58 = maxpd(auVar8,auVar58);
        dVar61 = auVar58._0_8_;
        dVar65 = auVar58._8_8_;
        uVar51 = -(ulong)(dVar71 <= ABS(dVar61));
        uVar52 = -(ulong)(dVar55 <= ABS(dVar65));
        auVar78._0_8_ = ~uVar51 & (ulong)(dVar61 * 9007199254740992.0);
        auVar78._8_8_ = ~uVar52 & (ulong)(dVar65 * 9007199254740992.0);
        auVar64._0_8_ = (ulong)dVar61 & uVar51;
        auVar64._8_8_ = (ulong)dVar65 & uVar52;
        auVar64 = auVar64 | auVar78;
        uVar50 = auVar64._4_4_ >> 0x14 & 0x7ff;
        uVar60 = auVar64._12_4_ >> 0x14 & 0x7ff;
        auVar56._8_8_ = -(ulong)(dVar65 != 0.0);
        auVar56._0_8_ = -(ulong)(dVar61 != 0.0);
        auVar73._0_4_ = -(uint)(uVar50 == 0x7ff);
        auVar73._4_4_ = -(uint)(uVar50 == 0x7ff);
        auVar73._8_4_ = -(uint)(uVar60 == 0x7ff);
        auVar73._12_4_ = -(uint)(uVar60 == 0x7ff);
        uVar72 = SUB168(~auVar73 & auVar56,0);
        uVar75 = SUB168(~auVar73 & auVar56,8);
        dVar66 = (double)(~uVar72 & (ulong)dVar61 |
                         (auVar64._0_8_ & 0x800fffffffffffff | 0x3fe0000000000000) & uVar72);
        dVar69 = (double)(~uVar75 & (ulong)dVar65 |
                         (auVar64._8_8_ & 0x800fffffffffffff | 0x3fe0000000000000) & uVar75);
        dVar67 = dVar66 + -1.0 + (double)(-(ulong)(dVar66 < 0.7071067811865476) & (ulong)dVar66);
        dVar70 = dVar69 + -1.0 + (double)(-(ulong)(dVar69 < 0.7071067811865476) & (ulong)dVar69);
        dVar61 = dVar67 * dVar67 * dVar67;
        dVar65 = dVar70 * dVar70 * dVar70;
        auVar57._0_8_ =
             ((dVar67 + 11.287358718916746) * dVar67 + 45.227914583753225) * dVar61 +
             (dVar67 * 82.98752669127767 + 71.15447506185639) * dVar67 + 23.125162012676533;
        auVar57._8_8_ =
             ((dVar70 + 11.287358718916746) * dVar70 + 45.227914583753225) * dVar65 +
             (dVar70 * 82.98752669127767 + 71.15447506185639) * dVar70 + 23.125162012676533;
        auVar79._0_8_ =
             (((dVar67 * 0.00010187566380458093 + 0.497494994976747) * dVar67 + 4.705791198788817) *
              dVar61 + (dVar67 * 14.498922534161093 + 17.936867850781983) * dVar67 +
                       7.708387337558854) * dVar61;
        auVar79._8_8_ =
             (((dVar70 * 0.00010187566380458093 + 0.497494994976747) * dVar70 + 4.705791198788817) *
              dVar65 + (dVar70 * 14.498922534161093 + 17.936867850781983) * dVar70 +
                       7.708387337558854) * dVar65;
        auVar58 = divpd(auVar79,auVar57);
        pdVar3 = pdVar31 + lVar43;
        *pdVar3 = (double)(~-(ulong)(dVar76 != 0.0) & 0xfff0000000000000 |
                          (~-(ulong)(dVar76 != INFINITY) & 0x7ff0000000000000 |
                           -(ulong)(dVar76 < 0.0) |
                          (ulong)(((double)(uVar72 & (ulong)((double)uVar50 +
                                                            (double)(uVar51 & 0xc08ff00000000000 |
                                                                    ~uVar51 & 0xc090cc0000000000)))
                                  - (double)(-(ulong)(dVar66 < 0.7071067811865476) &
                                            0x3ff0000000000000)) * 0.6931471805599453 +
                                 dVar67 * dVar67 * -0.5 + auVar58._0_8_ + dVar67) &
                          -(ulong)(dVar76 != INFINITY)) & -(ulong)(dVar76 != 0.0));
        pdVar3[1] = (double)(~-(ulong)(dVar77 != 0.0) & 0xfff0000000000000 |
                            (~-(ulong)(dVar77 != INFINITY) & 0x7ff0000000000000 |
                             -(ulong)(dVar77 < 0.0) |
                            (ulong)(((double)(uVar75 & (ulong)((double)uVar60 +
                                                              (double)(uVar52 & 0xc08ff00000000000 |
                                                                      ~uVar52 & 0xc090cc0000000000))
                                             ) -
                                    (double)(-(ulong)(dVar69 < 0.7071067811865476) &
                                            0x3ff0000000000000)) * 0.6931471805599453 +
                                   dVar70 * dVar70 * -0.5 + auVar58._8_8_ + dVar70) &
                            -(ulong)(dVar77 != INFINITY)) & -(ulong)(dVar77 != 0.0));
        lVar43 = lVar43 + 2;
      } while (lVar43 < (long)uVar36);
    }
    if ((long)uVar36 < (long)uVar41) {
      do {
        dVar71 = log(*(double *)(lVar39 + uVar36 * 8));
        pdVar31[uVar36] = dVar71;
        uVar36 = uVar36 + 1;
      } while (uVar41 != uVar36);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_388,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_728,local_728.m_rows - 3,0,3,
               local_728.m_cols);
    uVar14 = local_388._0_8_;
    lVar39 = *(long *)(local_388._24_8_ + 8);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,double,double>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_728,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_388,
               (assign_op<double,_double> *)local_500);
    if (0 < local_728.m_cols) {
      uVar41 = 0;
      lVar43 = 0;
      pdVar31 = local_728.m_data;
      pDVar48 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar14;
      do {
        if (0 < (long)uVar41) {
          local_728.m_data[lVar43 * local_728.m_rows] = *(double *)(uVar14 + lVar43 * lVar39 * 8);
        }
        uVar51 = local_728.m_rows - uVar41 & 0xfffffffffffffffe;
        lVar49 = uVar41 + uVar51;
        uVar36 = uVar41;
        if (0 < (long)uVar51) {
          do {
            dVar71 = *(double *)(pDVar48 + uVar36 * 8 + 8);
            pdVar31[uVar36] = *(double *)(pDVar48 + uVar36 * 8);
            (pdVar31 + uVar36)[1] = dVar71;
            uVar36 = uVar36 + 2;
          } while ((long)uVar36 < lVar49);
        }
        for (; lVar49 < local_728.m_rows; lVar49 = lVar49 + 1) {
          pdVar31[lVar49] = *(double *)(pDVar48 + lVar49 * 8);
        }
        uVar41 = (long)(uVar41 + ((uint)local_728.m_rows & 1)) % 2;
        if (local_728.m_rows < (long)uVar41) {
          uVar41 = local_728.m_rows;
        }
        lVar43 = lVar43 + 1;
        pDVar48 = pDVar48 + lVar39 * 8;
        pdVar31 = pdVar31 + local_728.m_rows;
      } while (lVar43 != local_728.m_cols);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_388,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_698,local_698._8_8_ - 3,0,3,1);
    uVar14 = local_388._0_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_698,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_388,
               (assign_op<double,_double> *)local_500);
    uVar41 = local_698._8_8_ - ((long)local_698._8_8_ >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)local_698._8_8_) {
      lVar39 = 0;
      do {
        pDVar48 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(uVar14 + lVar39 * 8);
        uVar13 = *(undefined8 *)(pDVar48 + 8);
        *(undefined8 *)(local_698._0_8_ + lVar39 * 8) = *(undefined8 *)pDVar48;
        *(undefined8 *)((pointer)(local_698._0_8_ + lVar39 * 8) + 8) = uVar13;
        lVar39 = lVar39 + 2;
      } while (lVar39 < (long)uVar41);
    }
    if ((long)uVar41 < (long)local_698._8_8_) {
      do {
        *(undefined8 *)(local_698._0_8_ + uVar41 * 8) = *(undefined8 *)(uVar14 + uVar41 * 8);
        uVar41 = uVar41 + 1;
      } while (local_698._8_8_ != uVar41);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)local_500,&local_728);
    Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::BDCSVD
              ((BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388,
               (MatrixType *)local_500,0x28);
    free((void *)local_500._0_8_);
    Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)local_388,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_698);
    local_628 = (undefined1  [8])0x0;
    MStack_620.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_6e8._0_8_ = local_388;
    local_6e8._8_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_698;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_628,
               (Index)local_328.m_other,1);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SVDBase<Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,_1,_0,__1,_1> *)local_628,(SrcXprType *)local_6e8,
          (assign_op<double,_double> *)local_500);
    Eigen::BDCSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~BDCSVD
              ((BDCSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_388);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"estimated order of convergence = ",0x21);
    pSVar34 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_628,1);
    poVar24 = std::ostream::_M_insert<double>(*pSVar34);
    local_388[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,local_388,1);
    free((void *)local_628);
    free((void *)local_698._0_8_);
    free(local_728.m_data);
    free(local_5e8.m_storage.m_data);
    if (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_638.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_);
    }
    free(local_5d8.m_storage.m_data);
    lf::mesh::hybrid2d::MeshFactory::~MeshFactory(&local_3e8);
    iVar20 = 0;
  }
  else {
    poVar24 = boost::program_options::operator<<((ostream *)&std::cout,&local_1a8);
    local_388[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar24,local_388,1);
    iVar20 = 1;
  }
  local_100.super_abstract_variables_map._vptr_abstract_variables_map =
       (_func_int **)&PTR__variables_map_0045aa10;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_100.m_required._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_100.m_final._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(&local_100.
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ._M_t);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_1a8.groups);
  if (local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_1a8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_1a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_caption._M_dataplus._M_p != &local_1a8.m_caption.field_2) {
    operator_delete(local_1a8.m_caption._M_dataplus._M_p,
                    local_1a8.m_caption.field_2._M_allocated_capacity + 1);
  }
  return iVar20;
}

Assistant:

int main(int argc, char** argv) {
  // define allowed command line arguments:
  namespace po = boost::program_options;
  po::options_description desc("Allowed options");
  // clang-format off
  desc.add_options()
  ("help", "produce this help message")
  ("quad_degree", po::value<int>()->default_value(3), "The degree of the local quadrature rule.")
  ("max_level", po::value<int>()->default_value(5), "The number of refinement levels")
  ;
  // clang-format on
  po::variables_map vm;
  po::store(po::parse_command_line(argc, argv, desc), vm);
  po::notify(vm);
  if (vm.count("help") != 0U) {
    std::cout << desc << '\n';
    return 1;
  }

  const int max_level = vm["max_level"].as<int>();
  const int quad_degree = vm["quad_degree"].as<int>();

  // Create a three element mesh that contains two triangles and one
  // quadrilateral
  lf::mesh::hybrid2d::MeshFactory mesh_factory(2);
  mesh_factory.AddPoint(Eigen::Vector2d{0, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{0.5, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{1, 0});
  mesh_factory.AddPoint(Eigen::Vector2d{1, 1});
  mesh_factory.AddPoint(Eigen::Vector2d{0.5, 1});
  mesh_factory.AddPoint(Eigen::Vector2d{0, 1});
  Eigen::MatrixXd node_coords(2, 3);
  node_coords << 0, 0.5, 0.5, 0, 0, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kTria(),
                         std::vector<lf::base::size_type>{0, 1, 4},
                         std::make_unique<lf::geometry::TriaO1>(node_coords));
  node_coords << 0, 0.5, 0, 0, 1, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kTria(),
                         std::vector<lf::base::size_type>{0, 4, 5},
                         std::make_unique<lf::geometry::TriaO1>(node_coords));
  node_coords = Eigen::MatrixXd(2, 4);
  node_coords << 0.5, 1, 1, 0.5, 0, 0, 1, 1;
  mesh_factory.AddEntity(lf::base::RefEl::kQuad(),
                         std::vector<lf::base::size_type>{1, 2, 3, 4},
                         std::make_unique<lf::geometry::QuadO1>(node_coords));

  auto base_mesh = mesh_factory.Build();

  // parameters:
  auto pi = boost::math::constants::pi<double>();
  auto f = [&](const Eigen::Vector2d& x) {
    return std::sin(pi * x(0)) * std::pow(std::cos(pi * x(1)), 2);
  };
  auto exact_integral = 1. / pi;

  auto mesh = base_mesh;
  auto errors = Eigen::VectorXd(max_level + 1);
  for (int level = 0; level <= max_level; ++level) {
    const lf::io::VtkWriter vtk_writer(
        mesh, "level" + std::to_string(level) + ".vtk");

    auto approx = integrate(*mesh, quad_degree, f);
    errors(level) = std::abs(approx - exact_integral);

    lf::refinement::MeshHierarchy mh(
        mesh, std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
    mh.RefineRegular();
    mesh = mh.getMesh(1);
  }

  std::cout << "measured errors for each level: " << '\n';
  std::cout << errors << '\n' << '\n';

  // estimate the rate of convergence:
  Eigen::MatrixXd A(max_level + 1, 2);
  A.col(0).setOnes();
  A.col(1) = (-Eigen::ArrayXd::LinSpaced(max_level + 1, 1, max_level + 1) *
              std::log(2))
                 .matrix();

  Eigen::VectorXd b = errors.transpose().array().log().matrix();

  // consider only the three smallest meshes:
  A = A.bottomRows(3);
  b = b.bottomRows(3);

  Eigen::VectorXd x =
      A.bdcSvd(Eigen::ComputeThinU | Eigen::ComputeThinV).solve(b);
  std::cout << "estimated order of convergence = " << x(1) << '\n';
}